

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_NewScArray<Js::OpLayoutDynamicProfile<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
          *playout)

{
  JavascriptLibrary *this_00;
  JavascriptArray *this_01;
  JavascriptArray *arr;
  OpLayoutDynamicProfile<Js::OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  this_00 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  this_01 = JavascriptLibrary::CreateArrayLiteral
                      (this_00,(uint)(playout->
                                     super_OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>
                                     ).C1);
  Js::JavascriptArray::CheckForceES5Array(this_01);
  SetReg<unsigned_char>
            (this,(playout->super_OpLayoutT_Reg1Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_>)
                  .R0,this_01);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScArray(const unaligned T * playout)
    {
        JavascriptArray *arr;
        arr = scriptContext->GetLibrary()->CreateArrayLiteral(playout->C1);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }